

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeLiteGenerator::GetCodeLiteCompilerName_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  cmGlobalGenerator *this_00;
  bool bVar1;
  char *pcVar2;
  string compilerId;
  string compilerIdVar;
  allocator local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"CMAKE_CXX_COMPILER_ID",(allocator *)&local_60);
  this_00 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  std::__cxx11::string::string((string *)&local_60,"CXX",&local_61);
  bVar1 = cmGlobalGenerator::GetLanguageEnabled(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar1) {
    std::__cxx11::string::assign((char *)&local_40);
  }
  pcVar2 = cmMakefile::GetSafeDefinition(mf,&local_40);
  std::__cxx11::string::string((string *)&local_60,pcVar2,&local_61);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"gnu g++",&local_61);
  bVar1 = std::operator==(&local_60,"MSVC");
  if (((bVar1) || (bVar1 = std::operator==(&local_60,"Clang"), bVar1)) ||
     (bVar1 = std::operator==(&local_60,"GNU"), bVar1)) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetCodeLiteCompilerName(
  const cmMakefile* mf) const
{
  // figure out which language to use
  // for now care only for C and C++
  std::string compilerIdVar = "CMAKE_CXX_COMPILER_ID";
  if (!this->GlobalGenerator->GetLanguageEnabled("CXX")) {
    compilerIdVar = "CMAKE_C_COMPILER_ID";
  }

  std::string compilerId = mf->GetSafeDefinition(compilerIdVar);
  std::string compiler = "gnu g++"; // default to g++

  // Since we need the compiler for parsing purposes only
  // it does not matter if we use clang or clang++, same as
  // "gnu gcc" vs "gnu g++"
  if (compilerId == "MSVC") {
    compiler = "VC++";
  } else if (compilerId == "Clang") {
    compiler = "clang++";
  } else if (compilerId == "GNU") {
    compiler = "gnu g++";
  }
  return compiler;
}